

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::prepareProgram
          (OperatorPerformanceCase *this,int progNdx)

{
  Vec4 *pVVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  float fVar2;
  int iVar3;
  ShaderProgram *pSVar4;
  pointer puVar5;
  pointer puVar6;
  Vec4 *pVVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  Vec4 *pVVar11;
  Vec4 *pVVar12;
  int iVar13;
  size_type __new_size;
  int iVar14;
  int iVar15;
  long lVar16;
  int compNdx;
  long lVar17;
  ulong uVar18;
  pointer pAVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  vector<float,_std::allocator<float>_> vertices;
  uint local_120;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  local_f0;
  AttribSpec local_d8;
  undefined1 *local_70;
  float afStack_68 [2];
  Vec4 local_60;
  Vec4 local_50;
  Vec4 local_40;
  long lVar10;
  
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  pSVar4 = (this->m_programs).
           super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
           ._M_impl.super__Vector_impl_data._M_start[progNdx].m_ptr;
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector(&local_f0,
           &(this->m_programData).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_start[progNdx].attributes);
  local_40.m_data[0] = -1.0;
  local_40.m_data[1] = -1.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 1.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = -1.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 1.0;
  local_60.m_data[0] = -1.0;
  local_60.m_data[1] = 1.0;
  local_60.m_data[2] = 0.0;
  local_60.m_data[3] = 1.0;
  local_70 = &DAT_3f8000003f800000;
  afStack_68[0] = 0.0;
  afStack_68[1] = 1.0;
  AttribSpec::AttribSpec(&local_d8,"a_position",&local_40,&local_50,&local_60,(Vec4 *)&local_70);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::push_back(&local_f0,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
    operator_delete(local_d8.name._M_dataplus._M_p,local_d8.name.field_2._M_allocated_capacity + 1);
  }
  puVar5 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar6) {
    (**(code **)(lVar10 + 0x438))((ulong)((long)puVar6 - (long)puVar5) >> 2);
  }
  this_00 = &this->m_attribBuffers;
  __new_size = ((long)local_f0.
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f0.
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  local_d8.name._M_dataplus._M_p = (pointer)((ulong)local_d8.name._M_dataplus._M_p._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_00,__new_size,(value_type_conflict4 *)&local_d8);
  (**(code **)(lVar10 + 0x6c8))
            ((ulong)((long)(this->m_attribBuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->m_attribBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  dVar9 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar9,"glGenBuffers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                  ,0x286);
  local_120 = (uint)__new_size;
  if (0 < (int)local_120) {
    pVVar12 = &(local_f0.
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start)->p10;
    uVar18 = 0;
    do {
      local_d8.name._M_dataplus._M_p = (pointer)0x0;
      local_d8.name._M_string_length = 0;
      local_d8.name.field_2._M_allocated_capacity = 0;
      iVar8 = this->m_gridSizeX;
      iVar3 = this->m_gridSizeY;
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&local_d8,(long)(iVar8 * iVar3 * 0x18));
      if (0 < iVar3) {
        pVVar1 = &local_f0.
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].p11;
        pVVar11 = &local_f0.
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].p00;
        iVar13 = 0;
        iVar14 = 0;
        do {
          if (0 < iVar8) {
            fVar24 = (float)iVar14 / (float)iVar3;
            fVar26 = (float)(iVar14 + 1) / (float)iVar3;
            fVar22 = 1.0 - fVar24;
            fVar23 = 1.0 - fVar26;
            iVar15 = 0;
            do {
              fVar28 = (float)iVar15 / (float)iVar8;
              fVar30 = fVar24 + fVar28;
              fVar31 = fVar24;
              pVVar7 = pVVar11;
              if (1.0 <= fVar30) {
                fVar31 = fVar22;
                pVVar7 = pVVar1;
              }
              iVar15 = iVar15 + 1;
              fVar29 = 1.0 - fVar28;
              uVar20 = -(uint)(fVar30 < 1.0);
              lVar16 = 0;
              do {
                fVar32 = pVVar12->m_data[lVar16];
                if (1.0 <= fVar30) {
                  fVar32 = pVVar12[-1].m_data[lVar16];
                }
                fVar33 = pVVar7->m_data[lVar16];
                *(float *)(local_d8.name._M_dataplus._M_p + (long)(iVar13 + (int)lVar16) * 4) =
                     ((float)(~uVar20 & (uint)pVVar12->m_data[lVar16] |
                             (uint)pVVar12[-1].m_data[lVar16] & uVar20) - fVar33) * fVar31 +
                     (fVar32 - fVar33) * (float)(~uVar20 & (uint)fVar29 | uVar20 & (uint)fVar28) +
                     fVar33;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              fVar31 = (float)iVar15 / (float)iVar8;
              fVar32 = fVar24 + fVar31;
              fVar30 = fVar24;
              pVVar7 = pVVar11;
              if (1.0 <= fVar32) {
                fVar30 = fVar22;
                pVVar7 = pVVar1;
              }
              fVar33 = 1.0 - fVar31;
              uVar20 = -(uint)(fVar32 < 1.0);
              iVar13 = iVar13 + 4;
              lVar16 = 0;
              do {
                fVar34 = *(float *)((long)pVVar12[-1].m_data + lVar16);
                fVar27 = *(float *)((long)pVVar12->m_data + lVar16);
                fVar25 = fVar27;
                if (1.0 <= fVar32) {
                  fVar25 = fVar34;
                }
                fVar2 = *(float *)((long)pVVar7->m_data + lVar16);
                lVar17 = (long)iVar13;
                iVar13 = iVar13 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar17 * 4) =
                     ((float)(~uVar20 & (uint)fVar27 | (uint)fVar34 & uVar20) - fVar2) * fVar30 +
                     (fVar25 - fVar2) * (float)(~uVar20 & (uint)fVar33 | uVar20 & (uint)fVar31) +
                     fVar2;
                lVar16 = lVar16 + 4;
              } while (lVar16 != 0x10);
              fVar27 = fVar26 + fVar28;
              fVar34 = fVar26;
              fVar30 = fVar28;
              pVVar7 = pVVar11;
              if (1.0 <= fVar27) {
                fVar34 = fVar23;
                fVar30 = fVar29;
                pVVar7 = pVVar1;
              }
              lVar16 = 0;
              do {
                fVar25 = pVVar12->m_data[lVar16];
                if (1.0 <= fVar27) {
                  fVar25 = pVVar12[-1].m_data[lVar16];
                }
                uVar21 = -(uint)(fVar27 < 1.0);
                fVar2 = pVVar7->m_data[lVar16];
                lVar17 = (long)iVar13;
                iVar13 = iVar13 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar17 * 4) =
                     ((float)(~uVar21 & (uint)pVVar12->m_data[lVar16] |
                             (uint)pVVar12[-1].m_data[lVar16] & uVar21) - fVar2) * fVar34 +
                     (fVar25 - fVar2) * fVar30 + fVar2;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              fVar34 = fVar24;
              fVar30 = fVar31;
              pVVar7 = pVVar11;
              if (1.0 <= fVar32) {
                fVar34 = fVar22;
                fVar30 = fVar33;
                pVVar7 = pVVar1;
              }
              lVar16 = 0;
              do {
                fVar25 = pVVar12->m_data[lVar16];
                if (1.0 <= fVar32) {
                  fVar25 = pVVar12[-1].m_data[lVar16];
                }
                fVar2 = pVVar7->m_data[lVar16];
                lVar17 = (long)iVar13;
                iVar13 = iVar13 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar17 * 4) =
                     ((float)(~uVar20 & (uint)pVVar12->m_data[lVar16] |
                             (uint)pVVar12[-1].m_data[lVar16] & uVar20) - fVar2) * fVar34 +
                     (fVar25 - fVar2) * fVar30 + fVar2;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              fVar32 = fVar26 + fVar31;
              fVar30 = fVar26;
              pVVar7 = pVVar11;
              if (1.0 <= fVar32) {
                fVar31 = fVar33;
                fVar30 = fVar23;
                pVVar7 = pVVar1;
              }
              lVar16 = 0;
              do {
                fVar33 = pVVar12->m_data[lVar16];
                if (1.0 <= fVar32) {
                  fVar33 = pVVar12[-1].m_data[lVar16];
                }
                fVar34 = pVVar7->m_data[lVar16];
                lVar17 = (long)iVar13;
                iVar13 = iVar13 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar17 * 4) =
                     ((float)(~-(uint)(fVar32 < 1.0) & (uint)pVVar12->m_data[lVar16] |
                             (uint)pVVar12[-1].m_data[lVar16] & -(uint)(fVar32 < 1.0)) - fVar34) *
                     fVar30 + (fVar33 - fVar34) * fVar31 + fVar34;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              fVar31 = fVar26;
              pVVar7 = pVVar11;
              if (1.0 <= fVar27) {
                fVar28 = fVar29;
                fVar31 = fVar23;
                pVVar7 = pVVar1;
              }
              lVar16 = 0;
              do {
                fVar30 = pVVar12->m_data[lVar16];
                if (1.0 <= fVar27) {
                  fVar30 = pVVar12[-1].m_data[lVar16];
                }
                fVar29 = pVVar7->m_data[lVar16];
                lVar17 = (long)iVar13;
                iVar13 = iVar13 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar17 * 4) =
                     ((float)(~uVar21 & (uint)pVVar12->m_data[lVar16] |
                             (uint)pVVar12[-1].m_data[lVar16] & uVar21) - fVar29) * fVar31 +
                     (fVar30 - fVar29) * fVar28 + fVar29;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
            } while (iVar15 != iVar8);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar3);
      }
      (**(code **)(lVar10 + 0x40))
                (0x8892,(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar18]);
      (**(code **)(lVar10 + 0x150))
                (0x8892,local_d8.name._M_string_length - (long)local_d8.name._M_dataplus._M_p,
                 local_d8.name._M_dataplus._M_p,0x88e4);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"Upload buffer data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                      ,0x28f);
      if (local_d8.name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8.name._M_dataplus._M_p,
                        local_d8.name.field_2._M_allocated_capacity -
                        (long)local_d8.name._M_dataplus._M_p);
      }
      uVar18 = uVar18 + 1;
      pVVar12 = pVVar12 + 6;
    } while (uVar18 != (local_120 & 0x7fffffff));
  }
  if (0 < (int)local_120) {
    uVar18 = 0;
    pAVar19 = local_f0.
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar8 = (**(code **)(lVar10 + 0x780))
                        ((pSVar4->m_program).m_program,(pAVar19->name)._M_dataplus._M_p);
      if (-1 < iVar8) {
        (**(code **)(lVar10 + 0x610))(iVar8);
        (**(code **)(lVar10 + 0x40))
                  (0x8892,(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start[uVar18]);
        (**(code **)(lVar10 + 0x19f0))(iVar8,4,0x1406,0,0,0);
      }
      uVar18 = uVar18 + 1;
      pAVar19 = pAVar19 + 1;
    } while ((local_120 & 0x7fffffff) != uVar18);
  }
  dVar9 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar9,"Setup vertex input state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                  ,0x29e);
  (**(code **)(lVar10 + 0x1680))((pSVar4->m_program).m_program);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])
            (this,(ulong)(pSVar4->m_program).m_program);
  (**(code **)(lVar10 + 0x1a00))(0,0,this->m_viewportWidth,this->m_viewportHeight);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector(&local_f0);
  return;
}

Assistant:

void OperatorPerformanceCase::prepareProgram (int progNdx)
{
	DE_ASSERT(progNdx < (int)m_programs.size());
	DE_ASSERT(m_programData.size() == m_programs.size());

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const ShaderProgram&	program		= *m_programs[progNdx];

	vector<AttribSpec>		attributes	= m_programData[progNdx].attributes;

	attributes.push_back(AttribSpec("a_position",
									Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
									Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
									Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
									Vec4( 1.0f,  1.0f, 0.0f, 1.0f)));

	DE_ASSERT(program.isOk());

	// Generate vertices.
	if (!m_attribBuffers.empty())
		gl.deleteBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	m_attribBuffers.resize(attributes.size(), 0);
	gl.genBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		std::vector<float> vertices;
		generateVertices(vertices, m_gridSizeX, m_gridSizeY, attributes[attribNdx]);

		gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertices.size()*sizeof(float)), &vertices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Upload buffer data");
	}

	// Setup attribute bindings.
	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program.getProgram(), attributes[attribNdx].name.c_str());

		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		}
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Setup vertex input state");

	gl.useProgram(program.getProgram());
	setGeneralUniforms(program.getProgram());
	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);
}